

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O2

void Abc_NtkManCutStop(Abc_ManCut_t *p)

{
  Vec_Vec_t *p_00;
  Vec_Ptr_t *p_01;
  int i;
  int i_00;
  
  Vec_PtrFree(p->vNodeLeaves);
  Vec_PtrFree(p->vConeLeaves);
  Vec_PtrFree(p->vVisited);
  p_00 = p->vLevels;
  for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
    p_01 = Vec_VecEntry(p_00,i_00);
    if (p_01 != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(p_01);
    }
  }
  Vec_PtrFree((Vec_Ptr_t *)p_00);
  Vec_PtrFree(p->vNodesTfo);
  free(p);
  return;
}

Assistant:

void Abc_NtkManCutStop( Abc_ManCut_t * p )
{
    Vec_PtrFree( p->vNodeLeaves );
    Vec_PtrFree( p->vConeLeaves );
    Vec_PtrFree( p->vVisited    );
    Vec_VecFree( p->vLevels );
    Vec_PtrFree( p->vNodesTfo );
    ABC_FREE( p );
}